

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O2

void LoadFileList(Configuration *config,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                 *components,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                 *files,path *sourceDir,bool inferredComponents,bool withLoc)

{
  bool bVar1;
  type tVar2;
  __type _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  reference pdVar8;
  Component *pCVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  difference_type dVar13;
  difference_type dVar14;
  char *pcVar15;
  size_type sVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
  _Var17;
  uintmax_t __len;
  void *__s;
  void *pvVar18;
  size_t sVar19;
  uintmax_t __n;
  _Alloc_hider _Var20;
  char cVar21;
  __node_base *p_Var22;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>,_bool>
  pVar23;
  undefined8 uStack_4f0;
  void *local_4d8;
  void *local_4d0;
  recursive_directory_iterator it;
  long local_4b0;
  recursive_directory_iterator end;
  string line;
  string nextLine;
  int local_418 [2];
  string local_410;
  string fileName;
  path local_3d0;
  path outputpath;
  char *local_390 [4];
  string local_370 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_350;
  string fileName_1;
  string pathS;
  int aiStack_218 [122];
  
  boost::filesystem::current_path();
  boost::filesystem::path::path((path *)&pathS,(sourceDir->m_pathname)._M_dataplus._M_p);
  boost::filesystem::current_path((path *)&pathS);
  std::__cxx11::string::~string((string *)&pathS);
  boost::filesystem::path::path((path *)&pathS,".");
  AddComponentDefinition(components,(path *)&pathS);
  std::__cxx11::string::~string((string *)&pathS);
  boost::filesystem::path::path((path *)&pathS,".");
  boost::filesystem::recursive_directory_iterator::recursive_directory_iterator(&it,(path *)&pathS);
  std::__cxx11::string::~string((string *)&pathS);
  end.m_imp.px = (intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>)
                 (recur_dir_itr_imp *)0x0;
LAB_00128ca3:
  tVar2 = boost::iterators::operator!=
                    ((iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                      *)&it,(iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                             *)&end);
  if (!tVar2) {
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&end.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&it.m_imp);
    boost::filesystem::current_path(&outputpath);
    std::__cxx11::string::~string((string *)&outputpath);
    return;
  }
  boost::filesystem::recursive_directory_iterator::dereference(&it);
  boost::filesystem::path::parent_path();
  boost::filesystem::recursive_directory_iterator::dereference(&it);
  boost::filesystem::path::filename();
  std::__cxx11::string::string((string *)&fileName,(string *)&pathS);
  std::__cxx11::string::~string((string *)&pathS);
  if ((fileName._M_string_length < 2) || (*fileName._M_dataplus._M_p != '.')) {
    pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&it);
    std::__cxx11::string::string((string *)&pathS,(string *)pdVar8);
    boost::filesystem::path::filename();
    std::__cxx11::string::string((string *)&fileName_1,(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    p_Var22 = &(config->blacklist)._M_h._M_before_begin;
LAB_00128d63:
    p_Var22 = p_Var22->_M_nxt;
    if (p_Var22 != (__node_base *)0x0) goto code_r0x00128d6c;
    std::__cxx11::string::~string((string *)&fileName_1);
    std::__cxx11::string::~string((string *)&pathS);
    if (inferredComponents) {
      AddComponentDefinition(components,&local_3d0);
    }
    boost::filesystem::recursive_directory_iterator::dereference(&it);
    boost::filesystem::path::filename();
    bVar4 = boost::filesystem::operator==((path *)&pathS,"CMakeLists.txt");
    std::__cxx11::string::~string((string *)&pathS);
    if (!bVar4) {
      boost::filesystem::recursive_directory_iterator::dereference(&it);
      boost::filesystem::directory_entry::status((directory_entry *)local_418);
      if (local_418[0] == 2) {
        pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&it);
        lVar12 = std::__cxx11::string::find((char *)pdVar8,0x12d8b5);
        if (lVar12 == -1) {
          boost::filesystem::recursive_directory_iterator::dereference(&it);
          boost::filesystem::path::extension();
          bVar4 = IsCode(&pathS);
          std::__cxx11::string::~string((string *)&pathS);
          if (bVar4) {
            __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  boost::filesystem::recursive_directory_iterator::dereference(&it);
            File::File((File *)&fileName_1,(path *)__x);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
            ::pair<File,_true>((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
                                *)&pathS,__x,(File *)&fileName_1);
            pVar23 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::pair<std::__cxx11::string,File>>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)files);
            _Var17 = pVar23.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                     ._M_cur;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
                     *)&pathS);
            File::~File((File *)&fileName_1);
            iVar6 = open((__x->_M_dataplus)._M_p,0);
            __len = boost::filesystem::file_size((path *)__x);
            __s = mmap((void *)0x0,__len,1,2,iVar6,0);
            if (__len != 0) {
              pcVar10 = (char *)memrchr(__s,0x23,__len);
              __n = __len;
              if ((pcVar10 != (char *)0x0) &&
                 ((iVar7 = strncmp(pcVar10,"#endif",6), iVar7 != 0 ||
                  (pcVar10 = (char *)memrchr(__s,0x23,(size_t)(pcVar10 + ~(ulong)__s)),
                  pcVar10 != (char *)0x0)))) {
                pvVar18 = memchr(pcVar10,10,(long)__s + (__len - (long)pcVar10));
                __n = (long)pvVar18 - (long)__s;
                if (pvVar18 == (void *)0x0) {
                  __n = __len;
                }
              }
              if (withLoc) {
                *(undefined8 *)
                 ((long)_Var17.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                        ._M_cur + 0xf0) = 0;
                lVar12 = 0;
                for (sVar19 = 0; __n != sVar19; sVar19 = sVar19 + 1) {
                  if (*(char *)((long)__s + sVar19) == '\n') {
                    lVar12 = lVar12 + 1;
                    *(long *)((long)_Var17.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                    ._M_cur + 0xf0) = lVar12;
                  }
                }
              }
              local_4d8 = memchr(__s,0x23,__n);
              local_4d0 = memchr(__s,0x2f,__n);
              uStack_4f0 = 0;
              local_4b0 = 0;
              for (uVar11 = 0; sVar19 = __n - uVar11, uVar11 <= __n && sVar19 != 0;
                  uVar11 = uVar11 + 1) {
                switch(uStack_4f0) {
                case 0:
                  if ((local_4d8 == (void *)0x0) ||
                     ((pvVar18 = (void *)(uVar11 + (long)__s), local_4d8 < pvVar18 &&
                      (local_4d8 = memchr(pvVar18,0x23,sVar19), local_4d8 == (void *)0x0))))
                  goto LAB_001298de;
                  if (local_4d0 == (void *)0x0) {
                    local_4d0 = (void *)0x0;
                  }
                  else {
                    if (local_4d0 < pvVar18) {
                      local_4d0 = memchr(pvVar18,0x2f,sVar19);
                    }
                    if ((local_4d0 != (void *)0x0) && (local_4d0 < local_4d8)) {
                      uVar11 = (long)local_4d0 - (long)__s;
                      uStack_4f0 = 0;
                      if (*(char *)((long)local_4d0 + 1) == '/') {
                        pvVar18 = memchr(local_4d0,10,__n - uVar11);
                        uVar11 = (long)pvVar18 - (long)__s;
                      }
                      else if (*(char *)((long)local_4d0 + 1) == '*') {
                        do {
                          pvVar18 = memchr((void *)((long)__s + uVar11 + 1),0x2f,__n - uVar11);
                          if (pvVar18 == (void *)0x0) goto LAB_001298de;
                          uVar11 = (long)pvVar18 - (long)__s;
                        } while (*(char *)((long)pvVar18 + -1) != '*');
                      }
                      break;
                    }
                  }
                  uVar11 = (long)local_4d8 - (long)__s;
LAB_001297df:
                  uStack_4f0 = 1;
                  break;
                case 1:
                  cVar21 = *(char *)((long)__s + uVar11);
                  if ((cVar21 == '\t') || (cVar21 == ' ')) goto LAB_001297df;
                  if (cVar21 == 'i') {
                    cVar21 = *(char *)((long)__s + uVar11 + 1);
                    if (cVar21 == 'n') {
                      if ((((*(char *)((long)__s + uVar11 + 2) != 'c') ||
                           (*(char *)((long)__s + uVar11 + 3) != 'l')) ||
                          (*(char *)((long)__s + uVar11 + 4) != 'u')) ||
                         ((*(char *)((long)__s + uVar11 + 5) != 'd' ||
                          (*(char *)((long)__s + uVar11 + 6) != 'e')))) goto LAB_001298d3;
                      uVar11 = uVar11 + 6;
                    }
                    else {
                      if (((cVar21 != 'm') || (*(char *)((long)__s + uVar11 + 2) != 'p')) ||
                         ((*(char *)((long)__s + uVar11 + 3) != 'o' ||
                          ((*(char *)((long)__s + uVar11 + 4) != 'r' ||
                           (*(char *)((long)__s + uVar11 + 5) != 't')))))) goto LAB_001298d3;
                      uVar11 = uVar11 + 5;
                    }
LAB_001298cb:
                    uStack_4f0 = 2;
                  }
                  else {
LAB_001298d3:
                    uStack_4f0 = 0;
                  }
                  break;
                case 2:
                  cVar21 = *(char *)((long)__s + uVar11);
                  if ((cVar21 == '\t') || (cVar21 == ' ')) goto LAB_001298cb;
                  if (cVar21 != '\"') {
                    if (cVar21 == '<') {
                      local_4b0 = uVar11 + 1;
                      goto LAB_00129764;
                    }
                    goto LAB_001298d3;
                  }
                  local_4b0 = uVar11 + 1;
LAB_0012987f:
                  uStack_4f0 = 4;
                  break;
                case 3:
                  if (*(char *)((long)__s + uVar11) == '>') {
                    pathS._M_dataplus._M_p = (pointer)&pathS.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&pathS,(long)__s + local_4b0,(long)__s + uVar11);
                    File::AddIncludeStmt
                              ((File *)((long)_Var17.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                              ._M_cur + 0x28),true,&pathS);
                    goto LAB_0012985d;
                  }
                  if (*(char *)((long)__s + uVar11) == '\n') goto LAB_001298d3;
LAB_00129764:
                  uStack_4f0 = 3;
                  break;
                case 4:
                  if (*(char *)((long)__s + uVar11) != '\"') {
                    if (*(char *)((long)__s + uVar11) != '\n') goto LAB_0012987f;
                    goto LAB_001298d3;
                  }
                  pathS._M_dataplus._M_p = (pointer)&pathS.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&pathS,(long)__s + local_4b0,(long)__s + uVar11);
                  File::AddIncludeStmt
                            ((File *)((long)_Var17.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                            ._M_cur + 0x28),false,&pathS);
LAB_0012985d:
                  std::__cxx11::string::~string((string *)&pathS);
                  uStack_4f0 = 0;
                }
              }
            }
LAB_001298de:
            munmap(__s,__len);
            close(iVar6);
          }
        }
        else {
          pCVar9 = AddComponentDefinition(components,&local_3d0);
          pCVar9->hasAddonCmake = true;
        }
      }
      goto LAB_00128dc1;
    }
    pdVar8 = boost::filesystem::recursive_directory_iterator::dereference(&it);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)&pathS,(path *)pdVar8);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    boost::filesystem::path::parent_path();
    pCVar9 = AddComponentDefinition(components,(path *)&fileName_1);
    std::__cxx11::string::~string((string *)&fileName_1);
    iVar6 = 0;
    bVar1 = false;
    bVar4 = false;
    goto LAB_00128eeb;
  }
  goto LAB_00128db6;
LAB_00128eeb:
  do {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&pathS,(string *)&line);
    _Var20 = line._M_dataplus;
    pcVar10 = strstr(line._M_dataplus._M_p,(config->regenTag)._M_dataplus._M_p);
    if (pcVar10 == (char *)0x0) {
      while (_Var20._M_p[line._M_string_length - 1] == '\\') {
        std::__cxx11::string::pop_back();
        nextLine._M_dataplus._M_p = (pointer)&nextLine.field_2;
        nextLine._M_string_length = 0;
        nextLine.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&pathS,(string *)&nextLine);
        std::__cxx11::string::append((string *)&line);
        std::__cxx11::string::~string((string *)&nextLine);
        _Var20 = line._M_dataplus;
      }
      if ((line._M_string_length == 0) || (*_Var20._M_p != '#')) {
        while (uVar11 = std::__cxx11::string::find((char *)&line,0x12d88d),
              uVar11 != 0xffffffffffffffff) {
          lVar12 = std::__cxx11::string::find((char *)&line,0x12d88d);
          std::__cxx11::string::replace((ulong)&line,uVar11 + 1,(char *)(~uVar11 + lVar12));
        }
        nextLine._M_dataplus._M_p._0_1_ = 0x28;
        dVar13 = std::
                 __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )line._M_dataplus._M_p,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(line._M_dataplus._M_p + line._M_string_length),
                            (_Iter_equals_val<const_char>)&nextLine);
        local_410._M_dataplus._M_p._0_1_ = 0x29;
        dVar14 = std::
                 __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )line._M_dataplus._M_p,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )(line._M_dataplus._M_p + line._M_string_length),
                            (_Iter_equals_val<const_char>)&local_410);
        iVar6 = ((int)dVar13 + iVar6) - (int)dVar14;
        iVar7 = strncmp(line._M_dataplus._M_p,"project(",8);
        cVar21 = (char)&line;
        if (iVar7 == 0) {
          lVar12 = std::__cxx11::string::find(cVar21,0x29);
          if (lVar12 != -1) {
            std::__cxx11::string::substr((ulong)&nextLine,(ulong)&line);
            std::__cxx11::string::operator=((string *)&pCVar9->name,(string *)&nextLine);
LAB_0012910f:
            std::__cxx11::string::~string((string *)&nextLine);
          }
        }
        else {
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&fileName_1,&(config->addLibraryAliases)._M_h);
          bVar5 = TryGetComponentType(pCVar9,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)&fileName_1,&line);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&fileName_1);
          if (!bVar5) {
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::_Hashtable(&local_350,&(config->addExecutableAliases)._M_h);
            bVar5 = TryGetComponentType(pCVar9,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)&local_350,&line);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&local_350);
            if (!bVar5) {
              if (bVar4) {
                bVar4 = iVar6 != 0;
                sVar16 = line._M_string_length;
                if (iVar6 == 0) {
                  sVar16 = std::__cxx11::string::rfind(cVar21,0x29);
                }
                if (sVar16 != 0) {
                  std::__cxx11::string::substr((ulong)&nextLine,(ulong)&line);
                  _Var20 = nextLine._M_dataplus;
                  pcVar10 = strstr(nextLine._M_dataplus._M_p,"${IMPLEMENTATION_SOURCES}");
                  if ((pcVar10 == (char *)0x0) &&
                     (pcVar10 = strstr(_Var20._M_p,"${IMPLEMENTATION_HEADERS}"),
                     pcVar10 == (char *)0x0)) {
                    std::__cxx11::string::string(local_370,(string *)&nextLine);
                    boost::filesystem::path::extension();
                    bVar5 = IsCode(&local_410);
                    std::__cxx11::string::~string((string *)&local_410);
                    std::__cxx11::string::~string(local_370);
                    if (!bVar5) {
                      std::operator+(&local_410,&nextLine,'\n');
                      std::__cxx11::string::append((string *)&pCVar9->additionalTargetParameters);
                      std::__cxx11::string::~string((string *)&local_410);
                    }
                  }
                  goto LAB_0012910f;
                }
              }
              else {
                if (config->reuseCustomSections == true) {
                  std::__cxx11::string::string((string *)local_390,(string *)&line);
                  pcVar10 = local_390[0];
                  pcVar15 = strstr(local_390[0],"target_link_libraries(");
                  if ((((((pcVar15 == (char *)0x0) &&
                         (pcVar15 = strstr(pcVar10,"add_subdirectory("), pcVar15 == (char *)0x0)) &&
                        (pcVar15 = strstr(pcVar10,"target_include_directories("),
                        pcVar15 == (char *)0x0)) &&
                       ((pcVar15 = strstr(pcVar10,"add_dependencies("), pcVar15 == (char *)0x0 &&
                        (pcVar15 = strstr(pcVar10,"include(CMakeAddon.txt)"), pcVar15 == (char *)0x0
                        )))) && (pcVar15 = strstr(pcVar10,"source_group(\"Implementation\\"),
                                pcVar15 == (char *)0x0)) &&
                     ((pcVar15 = strstr(pcVar10,"set(IMPLEMENTATION_SOURCES"),
                      pcVar15 == (char *)0x0 &&
                      (pcVar15 = strstr(pcVar10,"set(IMPLEMENTATION_HEADERS"),
                      pcVar15 == (char *)0x0)))) {
                    pcVar10 = strstr(pcVar10,"set(INTERFACE_FILES");
                    std::__cxx11::string::~string((string *)local_390);
                    bVar4 = true;
                    if (((pcVar10 == (char *)0x0) && (bVar4 = bVar1, !bVar1)) &&
                       (line._M_string_length != 0)) {
                      std::operator+(&nextLine,&line,'\n');
                      std::__cxx11::string::append((string *)&pCVar9->additionalCmakeDeclarations);
                      std::__cxx11::string::~string((string *)&nextLine);
                    }
                  }
                  else {
                    std::__cxx11::string::~string((string *)local_390);
                    bVar4 = true;
                  }
                  bVar1 = bVar4;
                  if (iVar6 == 0) {
                    bVar1 = false;
                  }
                  if (!bVar4) {
                    bVar1 = bVar4;
                  }
                }
                bVar4 = false;
              }
              goto LAB_00128f1c;
            }
          }
          bVar4 = true;
        }
      }
    }
    else {
      pCVar9->recreate = true;
    }
LAB_00128f1c:
  } while (*(int *)((long)aiStack_218 + *(long *)(pathS._M_dataplus._M_p + -0x18)) == 0);
  if (iVar6 != 0) {
    printf("final level of parentheses=%d\n");
    __assert_fail("parenLevel == 0 || (printf(\"final level of parentheses=%d\\n\", parenLevel), 0)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dascandy[P]cpp-dependencies/src/Input.cpp"
                  ,0x13c,
                  "void ReadCmakelist(const Configuration &, std::unordered_map<std::string, Component *> &, const filesystem::path &)"
                 );
  }
  std::__cxx11::string::~string((string *)&line);
  boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)&pathS);
  goto LAB_00128dc1;
code_r0x00128d6c:
  iVar6 = std::__cxx11::string::compare
                    ((ulong)&pathS,2,
                     *(string **)&((_Prime_rehash_policy *)(p_Var22 + 2))->_M_max_load_factor);
  if ((iVar6 == 0) ||
     (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var22 + 1),&fileName_1), _Var3)) goto LAB_00128d9c;
  goto LAB_00128d63;
LAB_00128d9c:
  std::__cxx11::string::~string((string *)&fileName_1);
  std::__cxx11::string::~string((string *)&pathS);
LAB_00128db6:
  boost::filesystem::recursive_directory_iterator::disable_recursion_pending(&it,true);
LAB_00128dc1:
  std::__cxx11::string::~string((string *)&fileName);
  std::__cxx11::string::~string((string *)&local_3d0);
  boost::filesystem::recursive_directory_iterator::increment(&it);
  goto LAB_00128ca3;
}

Assistant:

void LoadFileList(const Configuration& config,
                  std::unordered_map<std::string, Component *> &components,
                  std::unordered_map<std::string, File>& files,
                  const filesystem::path& sourceDir,
                  bool inferredComponents,
                  bool withLoc) {
    filesystem::path outputpath = filesystem::current_path();
    filesystem::current_path(sourceDir.c_str());
    AddComponentDefinition(components, ".");
    for (filesystem::recursive_directory_iterator it("."), end;
         it != end; ++it) {
        const auto &parent = it->path().parent_path();

        // skip hidden files and dirs
        std::string fileName = it->path().filename().generic_string();
        if ((fileName.size() >= 2 && fileName[0] == '.') ||
            IsItemBlacklisted(config, it->path())) {
#ifdef WITH_BOOST
            it.no_push();
#else
            it.disable_recursion_pending();
#endif
            continue;
        }       

        if (inferredComponents) AddComponentDefinition(components, parent);

        if (it->path().filename() == "CMakeLists.txt") {
            ReadCmakelist(config, components, it->path());
        } else if (filesystem::is_regular_file(it->status())) {
            if (it->path().generic_string().find("CMakeAddon.txt") != std::string::npos) {
                AddComponentDefinition(components, parent).hasAddonCmake = true;
            } else if (IsCode(it->path().extension().generic_string())) {
                ReadCode(files, it->path(), withLoc);
            }
        }
    }
    filesystem::current_path(outputpath);
}